

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O2

ON_Brep * ON_BrepWedge(ON_3dPoint *corners,ON_Brep *pBrep)

{
  ON_CurveArray *this;
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  ON_BrepVertex *pOVar6;
  ON_BrepEdge *pOVar7;
  ON_Surface *pOVar8;
  ON_3dPoint vertex_point;
  int iVar9;
  int iVar10;
  ON_Brep *this_00;
  ON_LineCurve *pOVar11;
  ON_NurbsSurface *pS;
  double *pdVar12;
  ON_BrepFace *face;
  ON_BrepLoop *loop;
  ON_BrepTrim *pOVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  ON_3dPoint *this_01;
  ON_BrepEdge *edge;
  ON_BrepEdge *edge_00;
  ON_BrepEdge *edge_01;
  ON_3dPoint *this_02;
  ON_3dPoint *p;
  int iVar18;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  double in_XMM1_Qa;
  long local_f0;
  ON_Interval s;
  ON_2dPoint p3;
  ON_2dPoint p1;
  ON_2dPoint p0;
  ON_Interval t;
  ON_2dPoint p2;
  
  if (corners != (ON_3dPoint *)0x0) {
    if (pBrep == (ON_Brep *)0x0) {
      this_00 = (ON_Brep *)operator_new(0x138);
      ON_Brep::ON_Brep(this_00);
    }
    else {
      ON_Brep::Destroy(pBrep);
      this_00 = pBrep;
    }
    ON_SimpleArray<ON_Curve_*>::Reserve(&(this_00->m_C2).super_ON_SimpleArray<ON_Curve_*>,0x12);
    this = &this_00->m_C3;
    ON_SimpleArray<ON_Curve_*>::Reserve(&this->super_ON_SimpleArray<ON_Curve_*>,9);
    ON_SimpleArray<ON_Surface_*>::Reserve(&(this_00->m_S).super_ON_SimpleArray<ON_Surface_*>,5);
    ON_ClassArray<ON_BrepVertex>::Reserve((ON_ClassArray<ON_BrepVertex> *)&this_00->m_V,6);
    ON_ClassArray<ON_BrepEdge>::Reserve((ON_ClassArray<ON_BrepEdge> *)&this_00->m_E,9);
    ON_ClassArray<ON_BrepLoop>::Reserve((ON_ClassArray<ON_BrepLoop> *)&this_00->m_L,5);
    ON_ClassArray<ON_BrepTrim>::Reserve((ON_ClassArray<ON_BrepTrim> *)&this_00->m_T,0x12);
    ON_ClassArray<ON_BrepFace>::Reserve((ON_ClassArray<ON_BrepFace> *)&this_00->m_F,5);
    for (lVar17 = 0; lVar17 != 0x90; lVar17 = lVar17 + 0x18) {
      vertex_point.z = *(double *)((long)&corners->z + lVar17);
      vertex_point._0_16_ = *(undefined1 (*) [16])((long)&corners->x + lVar17);
      ON_Brep::NewVertex(this_00,vertex_point,0.0);
    }
    uVar16 = 0;
    for (lVar17 = 0x10; lVar17 != 0x118; lVar17 = lVar17 + 0x58) {
      pOVar6 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      uVar14 = uVar16 + 1;
      uVar15 = 0;
      if (uVar14 != 3) {
        uVar15 = uVar14 & 0xffffffff;
      }
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar11,(ON_3dPoint *)
                         ((long)&(pOVar6->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                 _vptr_ON_Object + lVar17),&pOVar6[uVar15].super_ON_Point.point);
      s.m_t[0] = (double)pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append(&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&s);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)((long)pOVar6 + lVar17 + -0x10),pOVar6 + uVar15,
                       (int)uVar16,(ON_Interval *)0x0,0.0);
      uVar16 = uVar14;
    }
    uVar16 = 3;
    for (local_f0 = 0x108; local_f0 != 0x210; local_f0 = local_f0 + 0x58) {
      pOVar6 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      uVar14 = uVar16 + 1 & 0xffffffff;
      if (uVar16 == 5) {
        uVar14 = 3;
      }
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar11,(ON_3dPoint *)((long)&(pOVar6->super_ON_Point).point.x + local_f0),
                 &pOVar6[uVar14].super_ON_Point.point);
      s.m_t[0] = (double)pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append(&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&s);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)
                               ((long)&(pOVar6->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                       _vptr_ON_Object + local_f0),pOVar6 + uVar14,(int)uVar16,
                       (ON_Interval *)0x0,0.0);
      uVar16 = uVar16 + 1;
    }
    iVar18 = 6;
    for (lVar17 = 0x10; lVar17 != 0x118; lVar17 = lVar17 + 0x58) {
      pOVar6 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      ON_LineCurve::ON_LineCurve
                (pOVar11,(ON_3dPoint *)
                         ((long)&(pOVar6->super_ON_Point).super_ON_Geometry.super_ON_Object.
                                 _vptr_ON_Object + lVar17),
                 (ON_3dPoint *)
                 ((long)&pOVar6[3].super_ON_Point.super_ON_Geometry.super_ON_Object._vptr_ON_Object
                 + lVar17));
      s.m_t[0] = (double)pOVar11;
      ON_SimpleArray<ON_Curve_*>::Append(&this->super_ON_SimpleArray<ON_Curve_*>,(ON_Curve **)&s);
      ON_Brep::NewEdge(this_00,(ON_BrepVertex *)((long)pOVar6 + lVar17 + -0x10),
                       (ON_BrepVertex *)((long)&pOVar6[2].m_ei.m_count + lVar17),iVar18,
                       (ON_Interval *)0x0,0.0);
      iVar18 = iVar18 + 1;
    }
    for (lVar17 = 0x1c; lVar17 != 0xbc; lVar17 = lVar17 + 0x20) {
      pOVar6 = (this_00->m_V).super_ON_ObjectArray<ON_BrepVertex>.super_ON_ClassArray<ON_BrepVertex>
               .m_a;
      pOVar7 = (this_00->m_E).super_ON_ObjectArray<ON_BrepEdge>.super_ON_ClassArray<ON_BrepEdge>.m_a
      ;
      edge_01 = pOVar7 + *(int *)(&UNK_006a1884 + lVar17);
      edge_00 = pOVar7 + *(int *)(&UNK_006a1888 + lVar17);
      edge = pOVar7 + *(int *)(&UNK_006a188c + lVar17);
      iVar18 = *(int *)(&UNK_006a1890 + lVar17);
      iVar10 = *(int *)(&UNK_006a1894 + lVar17);
      iVar3 = *(int *)(&UNK_006a1898 + lVar17);
      iVar4 = *(int *)(&UNK_006a189c + lVar17);
      if ((long)iVar18 < 0) {
        p = &pOVar6[edge_01->m_vi[iVar10 != 0]].super_ON_Point.point;
        this_01 = &pOVar6[edge_00->m_vi[iVar3 != 0]].super_ON_Point.point;
        this_02 = &pOVar6[edge->m_vi[iVar4 != 0]].super_ON_Point.point;
        ON_3dPoint::operator-((ON_3dVector *)&t,this_02,p);
        ON_3dPoint::operator+((ON_3dPoint *)&s,this_01,(ON_3dVector *)&t);
        pS = ON_NurbsSurfaceQuadrilateral(p,this_01,(ON_3dPoint *)&s,this_02,(ON_NurbsSurface *)0x0)
        ;
      }
      else {
        pS = ON_NurbsSurfaceQuadrilateral
                       (&pOVar6[edge_01->m_vi[iVar10 != 0]].super_ON_Point.point,
                        &pOVar6[edge_00->m_vi[iVar3 != 0]].super_ON_Point.point,
                        &pOVar6[edge->m_vi[iVar4 != 0]].super_ON_Point.point,
                        &pOVar6[pOVar7[iVar18].m_vi[*(int *)((long)&DAT_006a18a0 + lVar17) != 0]].
                         super_ON_Point.point,(ON_NurbsSurface *)0x0);
      }
      iVar9 = ON_Brep::AddSurface(this_00,&pS->super_ON_Surface);
      pOVar8 = (this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[iVar9];
      (*(pOVar8->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x26])(pOVar8,0);
      s.m_t[0] = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
      s.m_t[1] = in_XMM1_Qa;
      (*((this_00->m_S).super_ON_SimpleArray<ON_Surface_*>.m_a[iVar9]->super_ON_Geometry).
        super_ON_Object._vptr_ON_Object[0x26])();
      t.m_t[1] = in_XMM1_Qa;
      pdVar12 = ON_Interval::operator[](&s,0);
      dVar2 = *pdVar12;
      pdVar12 = ON_Interval::operator[](&t,0);
      ON_2dPoint::Set(&p0,dVar2,*pdVar12);
      pdVar12 = ON_Interval::operator[](&s,1);
      dVar2 = *pdVar12;
      pdVar12 = ON_Interval::operator[](&t,0);
      ON_2dPoint::Set(&p1,dVar2,*pdVar12);
      pdVar12 = ON_Interval::operator[](&s,1);
      dVar2 = *pdVar12;
      pdVar12 = ON_Interval::operator[](&t,1);
      ON_2dPoint::Set(&p2,dVar2,*pdVar12);
      pdVar12 = ON_Interval::operator[](&s,0);
      dVar2 = *pdVar12;
      pdVar12 = ON_Interval::operator[](&t,1);
      in_XMM1_Qa = *pdVar12;
      ON_2dPoint::Set(&p3,dVar2,in_XMM1_Qa);
      face = ON_Brep::NewFace(this_00,iVar9);
      loop = ON_Brep::NewLoop(this_00,outer,face);
      pOVar11 = (ON_LineCurve *)operator_new(0x58);
      if (iVar18 < 0) {
        ON_LineCurve::ON_LineCurve(pOVar11,&p0,&p1);
        iVar18 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
        pOVar13 = ON_Brep::NewTrim(this_00,edge_01,iVar10 != 0,loop,iVar18);
        pOVar13->m_iso = S_iso;
        pOVar11 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar11,&p1,&p3);
        iVar18 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
        pOVar13 = ON_Brep::NewTrim(this_00,edge_00,iVar3 != 0,loop,iVar18);
        pOVar13->m_iso = not_iso;
        pOVar11 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar11,&p3,&p0);
        iVar18 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
        pOVar13 = ON_Brep::NewTrim(this_00,edge,iVar4 != 0,loop,iVar18);
      }
      else {
        ON_LineCurve::ON_LineCurve(pOVar11,&p0,&p1);
        iVar9 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
        pOVar13 = ON_Brep::NewTrim(this_00,edge_01,iVar10 != 0,loop,iVar9);
        pOVar13->m_iso = S_iso;
        pOVar11 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar11,&p1,&p2);
        iVar10 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
        pOVar13 = ON_Brep::NewTrim(this_00,edge_00,iVar3 != 0,loop,iVar10);
        pOVar13->m_iso = E_iso;
        pOVar11 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar11,&p2,&p3);
        iVar10 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
        pOVar13 = ON_Brep::NewTrim(this_00,edge,iVar4 != 0,loop,iVar10);
        pOVar13->m_iso = N_iso;
        pOVar11 = (ON_LineCurve *)operator_new(0x58);
        ON_LineCurve::ON_LineCurve(pOVar11,&p3,&p0);
        iVar10 = ON_Brep::AddTrimCurve(this_00,(ON_Curve *)pOVar11);
        pOVar13 = ON_Brep::NewTrim(this_00,pOVar7 + iVar18,
                                   *(int *)((long)&DAT_006a18a0 + lVar17) != 0,loop,iVar10);
      }
      pOVar13->m_iso = W_iso;
    }
    uVar5 = (this_00->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
            m_count;
    uVar14 = 0;
    uVar16 = (ulong)uVar5;
    if ((int)uVar5 < 1) {
      uVar16 = uVar14;
    }
    for (; uVar16 * 0xe8 - uVar14 != 0; uVar14 = uVar14 + 0xe8) {
      pOVar13 = (this_00->m_T).super_ON_ObjectArray<ON_BrepTrim>.super_ON_ClassArray<ON_BrepTrim>.
                m_a;
      iVar18 = (*(int *)((long)pOVar13->m_vi + (uVar14 - 4)) >> 0x1f) * -2 + 2;
      if (*(int *)((long)pOVar13->m_vi + uVar14) == *(int *)((long)pOVar13->m_vi + uVar14 + 4)) {
        iVar18 = 4;
      }
      *(int *)((long)pOVar13->m_vi + uVar14 + 0xc) = iVar18;
      puVar1 = (undefined8 *)((long)pOVar13->m_tolerance + uVar14);
      *puVar1 = 0;
      puVar1[1] = 0;
    }
    iVar18 = (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[6])(this_00,0);
    if ((char)iVar18 != '\0') {
      return this_00;
    }
    if (pBrep == (ON_Brep *)0x0) {
      (*(this_00->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(this_00);
    }
    else {
      ON_Brep::Destroy(pBrep);
    }
  }
  return (ON_Brep *)0x0;
}

Assistant:

ON_Brep* ON_BrepWedge( const ON_3dPoint* corners, ON_Brep* pBrep )
{
  ON_Brep* brep = 0;

  int vi, ei, ti, fi, si, c2i;
  
  if(corners)
  {
    // use the one passed in or make a new one
    if( pBrep ) 
    {
      pBrep->Destroy();
      brep = pBrep;
    }
    else
      brep = new ON_Brep();
    
    brep->m_C2.Reserve(18);
    brep->m_C3.Reserve(9);
    brep->m_S.Reserve(5);
    brep->m_V.Reserve(6);
    brep->m_E.Reserve(9);
    brep->m_L.Reserve(5);
    brep->m_T.Reserve(18);
    brep->m_F.Reserve(5);

    // vertices
    for ( vi = 0; vi < 6; vi++ )
    {
      brep->NewVertex( corners[vi], 0.0 );
    }
    
    // 3d edges around bottom e0 - e2
    for ( ei = 0; ei < 3; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[(ei+1)%3];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    // 3d edges around top e3 - e5
    for ( ei = 3; ei < 6; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei];
      ON_BrepVertex& v1 = brep->m_V[ei==5?3:(ei+1)];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }
    // 3d vertical edges e6 - e8
    for ( ei = 6; ei < 9; ei++ )
    {
      ON_BrepVertex& v0 = brep->m_V[ei-6];
      ON_BrepVertex& v1 = brep->m_V[ei-3];
      brep->m_C3.Append( new ON_LineCurve( v0.point, v1.point ) );
      brep->NewEdge( v0, v1, ei, nullptr, 0.0 );
    }

    /*
    //
    //                      /v5    
    //                     /|\       
    //                    / | \     
    //                   e5 |  e4   
    //                  /   e8  \     
    //                 /__e3_____\  
    //               v3|    |    |v4     
    //                 |    |    |       
    //                 |    /v2  |   
    //                 e6  / \   e7   
    //                 |  /   \  |   
    //                 | e2    e1|   
    //                 |/       \|     
    //                 /____e0___\  
    //               v0           v1
    */

    struct {
      int e[4], bRev[4];
    } f[5] = {
      {{0, 7, 3, 6},  {false, false, true,  true}},  // vertical front
      {{1, 8, 4, 7},  {false, false, true,  true}},  // vertical right
      {{2, 6, 5, 8},  {false, false, true,  true}},  // vertical left
      {{2, 1, 0,-1},  {true,  true,  true,  true}},  // bottom
      {{3, 4, 5,-1},  {false, false, false, false}}  // top
    };
    for ( fi = 0; fi < 5; fi++ )
    {
      ON_BrepEdge* e0;
      ON_BrepEdge* e1;
      ON_BrepEdge* e2;
      ON_BrepEdge* e3=0;

      e0 = &brep->m_E[f[fi].e[0]];
      e1 = &brep->m_E[f[fi].e[1]];
      e2 = &brep->m_E[f[fi].e[2]];
      if( f[fi].e[3] >= 0)
        e3 = &brep->m_E[f[fi].e[3]];

      ON_BrepVertex* v0;
      ON_BrepVertex* v1;
      ON_BrepVertex* v2;
      ON_BrepVertex* v3=0;

      v0 = &brep->m_V[e0->m_vi[f[fi].bRev[0]?1:0]];
      v1 = &brep->m_V[e1->m_vi[f[fi].bRev[1]?1:0]];
      v2 = &brep->m_V[e2->m_vi[f[fi].bRev[2]?1:0]];
      if( f[fi].e[3] >= 0)
        v3 = &brep->m_V[e3->m_vi[f[fi].bRev[3]?1:0]];

      ON_NurbsSurface* srf;

      if( f[fi].e[3] >= 0)
        // 4 sided face
        srf = ON_NurbsSurfaceQuadrilateral( v0->point, v1->point, v2->point, v3->point);
      else
        // 3 sided face
        srf = ON_NurbsSurfaceQuadrilateral( v0->point, v1->point, v1->point + (v2->point - v0->point), v2->point);

      si = brep->AddSurface( srf);

      ON_Interval s = brep->m_S[si]->Domain(0);
      ON_Interval t = brep->m_S[si]->Domain(1);
      ON_2dPoint p0, p1, p2, p3;
      p0.Set(s[0],t[0]);
      p1.Set(s[1],t[0]);
      p2.Set(s[1],t[1]);
      p3.Set(s[0],t[1]);

      ON_BrepFace& face = brep->NewFace( si );
      ON_BrepLoop& loop = brep->NewLoop( ON_BrepLoop::outer, face );

      if( f[fi].e[3] >= 0)
      {
        // south side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
        brep->NewTrim( *e0, f[fi].bRev[0], loop, c2i ).m_iso = ON_Surface::S_iso;
        
        // east side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p2 ) );
        brep->NewTrim( *e1, f[fi].bRev[1], loop, c2i ).m_iso = ON_Surface::E_iso;
        
        // north side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p2, p3 ) );
        brep->NewTrim( *e2, f[fi].bRev[2], loop, c2i ).m_iso = ON_Surface::N_iso;

        // west side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
        brep->NewTrim( *e3, f[fi].bRev[3], loop, c2i ).m_iso = ON_Surface::W_iso;
      }
      else
      {
        // south side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p0, p1 ) );
        brep->NewTrim( *e0, f[fi].bRev[0], loop, c2i ).m_iso = ON_Surface::S_iso;
        
        // diagonal from upper left to lower right
        c2i = brep->AddTrimCurve( new ON_LineCurve( p1, p3 ) );
        brep->NewTrim( *e1, f[fi].bRev[1], loop, c2i ).m_iso = ON_Surface::not_iso;

        // west side of surface
        c2i = brep->AddTrimCurve( new ON_LineCurve( p3, p0 ) );
        brep->NewTrim( *e2, f[fi].bRev[2], loop, c2i ).m_iso = ON_Surface::W_iso;
      }
    }

    // set trim m_type and m_tolerance[]
    for ( ti = 0; ti < brep->m_T.Count(); ti++ )
    {
      ON_BrepTrim& trim = brep->m_T[ti];
      trim.m_type =  ( trim.m_vi[0] != trim.m_vi[1] && trim.m_ei >= 0 )
                  ? ON_BrepTrim::mated
                  : ON_BrepTrim::singular;
      trim.m_tolerance[0] = 0.0;
      trim.m_tolerance[1] = 0.0;
    }

    if ( !brep->IsValid() ) {
      if ( pBrep )
        pBrep->Destroy();
      else
        delete brep;
      brep = 0;
    }
  }
  else 
    brep = 0;
  return brep;
}